

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbanks_decoder.cpp
# Opt level: O2

HuffmanTree * io::decode_huffman_tree(ROM *rom,uint32_t addr)

{
  bool bVar1;
  HuffmanTree *this;
  HuffmanTreeNode *pHVar2;
  HuffmanTreeNode *pHVar3;
  HuffmanTreeNode *pHVar4;
  BitstreamReader bitstream;
  
  this = (HuffmanTree *)operator_new(0x38);
  HuffmanTree::HuffmanTree(this);
  bitstream._data =
       (rom->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + addr;
  bitstream._bit_position = '\a';
  bitstream._size = 0;
  pHVar4 = this->_root_node;
  do {
    addr = addr - 1;
    while( true ) {
      bVar1 = BitstreamReader::next_bit(&bitstream);
      if (bVar1) break;
      pHVar2 = (HuffmanTreeNode *)operator_new(0x20);
      pHVar2->_leftChild = (HuffmanTreeNode *)0x0;
      pHVar2->_rightChild = (HuffmanTreeNode *)0x0;
      pHVar2->_parent = (HuffmanTreeNode *)0x0;
      *(undefined8 *)&pHVar2->_symbol = 0;
      pHVar4->_leftChild = pHVar2;
      pHVar2->_parent = pHVar4;
      pHVar4 = pHVar2;
    }
    pHVar4->_symbol =
         (rom->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start[addr];
    do {
      pHVar2 = pHVar4;
      pHVar4 = pHVar2->_parent;
      if (pHVar4 == (HuffmanTreeNode *)0x0) break;
    } while (pHVar4->_rightChild != (HuffmanTreeNode *)0x0);
    if (pHVar2 == this->_root_node) {
      return this;
    }
    pHVar3 = (HuffmanTreeNode *)operator_new(0x20);
    pHVar3->_leftChild = (HuffmanTreeNode *)0x0;
    pHVar3->_rightChild = (HuffmanTreeNode *)0x0;
    pHVar3->_parent = (HuffmanTreeNode *)0x0;
    *(undefined8 *)&pHVar3->_symbol = 0;
    pHVar4->_rightChild = pHVar3;
    pHVar3->_parent = pHVar4;
    pHVar4 = pHVar2->_parent->_rightChild;
  } while( true );
}

Assistant:

HuffmanTree* io::decode_huffman_tree(const md::ROM& rom, uint32_t addr)
{
    HuffmanTree* tree = new HuffmanTree();
    HuffmanTreeNode* current_node = tree->root_node();
    uint32_t current_symbol_addr = addr - 1;

    BitstreamReader bitstream(rom.iterator_at(addr));

    while(true)
    {
        if(!bitstream.next_bit())
        {
            // Branch node case
            current_node->left_child(new HuffmanTreeNode());
            current_node = current_node->left_child();
        }
        else
        {
            // Leaf node case: read the symbol value BEFORE the initial offset
            current_node->symbol(rom.get_byte(current_symbol_addr));
            current_symbol_addr -= 1;

            // If current node's parent has a right child, it means we completed this branch of the tree
            // and we need to get back at a higher level
            while (current_node->parent() && current_node->parent()->right_child())
            {
                current_node = current_node->parent();
            }

            // If we got back to root node, it means the whole tree is finished
            if (current_node == tree->root_node())
                return tree;

            current_node->parent()->right_child(new HuffmanTreeNode());
            current_node = current_node->parent()->right_child();
        }
    }
}